

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_stage6_ssse3(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  longlong lVar7;
  longlong lVar8;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i alVar39;
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i alVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  alVar39 = x[4];
  alVar41 = x[6];
  lVar7 = x[7][0];
  uVar1 = *(undefined2 *)((long)x[7] + 2);
  uVar2 = *(undefined2 *)((long)x[7] + 4);
  uVar3 = *(undefined2 *)((long)x[7] + 6);
  lVar8 = x[7][1];
  uVar4 = *(undefined2 *)((long)x[7] + 10);
  uVar5 = *(undefined2 *)((long)x[7] + 0xc);
  uVar6 = *(undefined2 *)((long)x[7] + 0xe);
  auVar36._0_12_ = alVar39._0_12_;
  auVar36._12_2_ = alVar39[0]._6_2_;
  auVar36._14_2_ = *(undefined2 *)((long)x[5] + 6);
  auVar35._12_4_ = auVar36._12_4_;
  auVar35._0_10_ = alVar39._0_10_;
  auVar35._10_2_ = *(undefined2 *)((long)x[5] + 4);
  auVar34._10_6_ = auVar35._10_6_;
  auVar34._0_8_ = alVar39[0];
  auVar34._8_2_ = alVar39[0]._4_2_;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._6_2_ = *(undefined2 *)((long)x[5] + 2);
  auVar33._4_2_ = alVar39[0]._2_2_;
  auVar33._0_2_ = (undefined2)alVar39[0];
  auVar33._2_2_ = (short)x[5][0];
  auVar21._2_2_ = (short)x[5][1];
  auVar21._0_2_ = (short)alVar39[1];
  auVar21._4_2_ = alVar39[1]._2_2_;
  auVar21._6_2_ = *(undefined2 *)((long)x[5] + 10);
  auVar21._8_2_ = alVar39[1]._4_2_;
  auVar21._10_2_ = *(undefined2 *)((long)x[5] + 0xc);
  auVar21._12_2_ = alVar39[1]._6_2_;
  auVar21._14_2_ = *(undefined2 *)((long)x[5] + 0xe);
  auVar19._8_4_ = 0x61f0ec8;
  auVar19._0_8_ = 0x61f0ec8061f0ec8;
  auVar19._12_4_ = 0x61f0ec8;
  auVar43 = pmaddwd(auVar33,auVar19);
  auVar49 = pmaddwd(auVar21,auVar19);
  auVar30._8_4_ = 0xf138061f;
  auVar30._0_8_ = 0xf138061ff138061f;
  auVar30._12_4_ = 0xf138061f;
  auVar37 = pmaddwd(auVar33,auVar30);
  auVar22 = pmaddwd(auVar21,auVar30);
  auVar44._0_4_ = auVar43._0_4_ + in_XMM0_Da >> 0xc;
  auVar44._4_4_ = auVar43._4_4_ + in_XMM0_Db >> 0xc;
  auVar44._8_4_ = auVar43._8_4_ + in_XMM0_Dc >> 0xc;
  auVar44._12_4_ = auVar43._12_4_ + in_XMM0_Dd >> 0xc;
  auVar50._0_4_ = auVar49._0_4_ + in_XMM0_Da >> 0xc;
  auVar50._4_4_ = auVar49._4_4_ + in_XMM0_Db >> 0xc;
  auVar50._8_4_ = auVar49._8_4_ + in_XMM0_Dc >> 0xc;
  auVar50._12_4_ = auVar49._12_4_ + in_XMM0_Dd >> 0xc;
  alVar45 = (__m128i)packssdw(auVar44,auVar50);
  auVar38._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  auVar23._0_4_ = auVar22._0_4_ + in_XMM0_Da >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + in_XMM0_Db >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + in_XMM0_Dc >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar38,auVar23);
  x[4] = alVar45;
  x[5] = alVar39;
  auVar27._0_12_ = alVar41._0_12_;
  auVar27._12_2_ = alVar41[0]._6_2_;
  auVar27._14_2_ = uVar3;
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = alVar41._0_10_;
  auVar26._10_2_ = uVar2;
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = alVar41[0];
  auVar25._8_2_ = alVar41[0]._4_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = uVar1;
  auVar24._4_2_ = alVar41[0]._2_2_;
  auVar24._0_2_ = (undefined2)alVar41[0];
  auVar24._2_2_ = (short)lVar7;
  auVar11._2_2_ = (short)lVar8;
  auVar11._0_2_ = (short)alVar41[1];
  auVar11._4_2_ = alVar41[1]._2_2_;
  auVar11._6_2_ = uVar4;
  auVar11._8_2_ = alVar41[1]._4_2_;
  auVar11._10_2_ = uVar5;
  auVar11._12_2_ = alVar41[1]._6_2_;
  auVar11._14_2_ = uVar6;
  auVar22._8_4_ = 0xec8f9e1;
  auVar22._0_8_ = 0xec8f9e10ec8f9e1;
  auVar22._12_4_ = 0xec8f9e1;
  auVar49 = pmaddwd(auVar24,auVar22);
  auVar46 = pmaddwd(auVar11,auVar22);
  auVar43 = pmaddwd(auVar24,auVar19);
  auVar37 = pmaddwd(auVar11,auVar19);
  auVar40._0_4_ = auVar49._0_4_ + in_XMM0_Da >> 0xc;
  auVar40._4_4_ = auVar49._4_4_ + in_XMM0_Db >> 0xc;
  auVar40._8_4_ = auVar49._8_4_ + in_XMM0_Dc >> 0xc;
  auVar40._12_4_ = auVar49._12_4_ + in_XMM0_Dd >> 0xc;
  auVar47._0_4_ = auVar46._0_4_ + in_XMM0_Da >> 0xc;
  auVar47._4_4_ = auVar46._4_4_ + in_XMM0_Db >> 0xc;
  auVar47._8_4_ = auVar46._8_4_ + in_XMM0_Dc >> 0xc;
  auVar47._12_4_ = auVar46._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar40,auVar47);
  auVar28._0_4_ = auVar43._0_4_ + in_XMM0_Da >> 0xc;
  auVar28._4_4_ = auVar43._4_4_ + in_XMM0_Db >> 0xc;
  auVar28._8_4_ = auVar43._8_4_ + in_XMM0_Dc >> 0xc;
  auVar28._12_4_ = auVar43._12_4_ + in_XMM0_Dd >> 0xc;
  auVar12._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar12._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar12._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar12._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar28,auVar12);
  x[6] = alVar41;
  x[7] = alVar39;
  alVar39 = x[0xc];
  auVar16._0_12_ = alVar39._0_12_;
  auVar16._12_2_ = alVar39[0]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)x[0xd] + 6);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar39._0_10_;
  auVar15._10_2_ = *(undefined2 *)((long)x[0xd] + 4);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar39[0];
  auVar14._8_2_ = alVar39[0]._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = *(undefined2 *)((long)x[0xd] + 2);
  auVar13._4_2_ = alVar39[0]._2_2_;
  auVar13._0_2_ = (undefined2)alVar39[0];
  auVar13._2_2_ = (short)x[0xd][0];
  auVar29._2_2_ = (short)x[0xd][1];
  auVar29._0_2_ = (short)alVar39[1];
  auVar29._4_2_ = alVar39[1]._2_2_;
  auVar29._6_2_ = *(undefined2 *)((long)x[0xd] + 10);
  auVar29._8_2_ = alVar39[1]._4_2_;
  auVar29._10_2_ = *(undefined2 *)((long)x[0xd] + 0xc);
  auVar29._12_2_ = alVar39[1]._6_2_;
  auVar29._14_2_ = *(undefined2 *)((long)x[0xd] + 0xe);
  auVar43 = pmaddwd(auVar13,auVar19);
  auVar49 = pmaddwd(auVar29,auVar19);
  auVar37 = pmaddwd(auVar13,auVar30);
  auVar30 = pmaddwd(auVar29,auVar30);
  auVar42._0_4_ = auVar43._0_4_ + in_XMM0_Da >> 0xc;
  auVar42._4_4_ = auVar43._4_4_ + in_XMM0_Db >> 0xc;
  auVar42._8_4_ = auVar43._8_4_ + in_XMM0_Dc >> 0xc;
  auVar42._12_4_ = auVar43._12_4_ + in_XMM0_Dd >> 0xc;
  auVar48._0_4_ = auVar49._0_4_ + in_XMM0_Da >> 0xc;
  auVar48._4_4_ = auVar49._4_4_ + in_XMM0_Db >> 0xc;
  auVar48._8_4_ = auVar49._8_4_ + in_XMM0_Dc >> 0xc;
  auVar48._12_4_ = auVar49._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar42,auVar48);
  auVar17._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar17._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar17._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar17._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  auVar31._0_4_ = auVar30._0_4_ + in_XMM0_Da >> 0xc;
  auVar31._4_4_ = auVar30._4_4_ + in_XMM0_Db >> 0xc;
  auVar31._8_4_ = auVar30._8_4_ + in_XMM0_Dc >> 0xc;
  auVar31._12_4_ = auVar30._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar17,auVar31);
  x[0xc] = alVar41;
  x[0xd] = alVar39;
  alVar39 = x[0xe];
  auVar9._0_12_ = alVar39._0_12_;
  auVar9._12_2_ = alVar39[0]._6_2_;
  auVar9._14_2_ = *(undefined2 *)((long)x[0xf] + 6);
  auVar46._12_4_ = auVar9._12_4_;
  auVar46._0_10_ = alVar39._0_10_;
  auVar46._10_2_ = *(undefined2 *)((long)x[0xf] + 4);
  auVar49._10_6_ = auVar46._10_6_;
  auVar49._0_8_ = alVar39[0];
  auVar49._8_2_ = alVar39[0]._4_2_;
  auVar43._8_8_ = auVar49._8_8_;
  auVar43._6_2_ = *(undefined2 *)((long)x[0xf] + 2);
  auVar43._4_2_ = alVar39[0]._2_2_;
  auVar43._0_2_ = (undefined2)alVar39[0];
  auVar43._2_2_ = (short)x[0xf][0];
  auVar18._2_2_ = (short)x[0xf][1];
  auVar18._0_2_ = (short)alVar39[1];
  auVar18._4_2_ = alVar39[1]._2_2_;
  auVar18._6_2_ = *(undefined2 *)((long)x[0xf] + 10);
  auVar18._8_2_ = alVar39[1]._4_2_;
  auVar18._10_2_ = *(undefined2 *)((long)x[0xf] + 0xc);
  auVar18._12_2_ = alVar39[1]._6_2_;
  auVar18._14_2_ = *(undefined2 *)((long)x[0xf] + 0xe);
  auVar37 = pmaddwd(auVar43,auVar22);
  auVar22 = pmaddwd(auVar22,auVar18);
  auVar30 = pmaddwd(auVar43,auVar19);
  auVar19 = pmaddwd(auVar18,auVar19);
  auVar32._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar32._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar32._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar32._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  auVar37._0_4_ = auVar22._0_4_ + in_XMM0_Da >> 0xc;
  auVar37._4_4_ = auVar22._4_4_ + in_XMM0_Db >> 0xc;
  auVar37._8_4_ = auVar22._8_4_ + in_XMM0_Dc >> 0xc;
  auVar37._12_4_ = auVar22._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar32,auVar37);
  auVar10._0_4_ = auVar30._0_4_ + in_XMM0_Da >> 0xc;
  auVar10._4_4_ = auVar30._4_4_ + in_XMM0_Db >> 0xc;
  auVar10._8_4_ = auVar30._8_4_ + in_XMM0_Dc >> 0xc;
  auVar10._12_4_ = auVar30._12_4_ + in_XMM0_Dd >> 0xc;
  auVar20._0_4_ = auVar19._0_4_ + in_XMM0_Da >> 0xc;
  auVar20._4_4_ = auVar19._4_4_ + in_XMM0_Db >> 0xc;
  auVar20._8_4_ = auVar19._8_4_ + in_XMM0_Dc >> 0xc;
  auVar20._12_4_ = auVar19._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar10,auVar20);
  x[0xe] = alVar41;
  x[0xf] = alVar39;
  return;
}

Assistant:

static inline void iadst16_stage6_ssse3(__m128i *x, const int32_t *cospi,
                                        const __m128i __rounding,
                                        int8_t cos_bit) {
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x[14], x[15], x[14], x[15]);
}